

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef rec_cat(jit_State *J,BCReg baseslot,BCReg topslot)

{
  TValue TVar1;
  TRef *pTVar2;
  TValue TVar3;
  TValue TVar4;
  TValue TVar5;
  TValue TVar6;
  TRef TVar7;
  TRef TVar8;
  TValue *pTVar9;
  uint *puVar10;
  uint *puVar11;
  BCReg BVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  TValue savetv [5];
  RecordIndex ix;
  TValue local_78;
  TValue local_70;
  uint local_48;
  uint local_44;
  
  puVar10 = J->base + topslot;
  uVar13 = (ulong)baseslot;
  if (baseslot <= topslot) {
    do {
      if (J->base[uVar13] == 0) {
        sload(J,(int)uVar13);
      }
      uVar15 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar15;
    } while (uVar15 <= topslot);
  }
  if ((((*puVar10 & 0x1f000000) == 0x4000000) || ((*puVar10 >> 0x18 & 0x1e) - 0xe < 6)) &&
     (((puVar10[-1] & 0x1f000000) == 0x4000000 || ((puVar10[-1] >> 0x18 & 0x1e) - 0xe < 6)))) {
    pTVar2 = J->base;
    for (puVar11 = puVar10; pTVar2 + baseslot <= puVar11; puVar11 = puVar11 + -1) {
      uVar15 = *puVar11;
      if ((uVar15 >> 0x18 & 0x1e) - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5d04;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar15;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((uVar15 & 0x1f000000) == 0xe000000);
        TVar7 = lj_opt_fold(J);
        *puVar11 = TVar7;
      }
      else if ((uVar15 & 0x1f000000) != 0x4000000) break;
    }
    puVar11 = puVar11 + 1;
    TVar7 = lj_ir_kptr_(J,IR_KPTR,J[-1].penalty + 0x31);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55090000;
    TVar8 = lj_opt_fold(J);
    puVar14 = puVar11;
    TVar7 = TVar8;
    do {
      uVar15 = *puVar14;
      puVar14 = puVar14 + 1;
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar15;
      TVar7 = lj_opt_fold(J);
    } while (puVar14 <= puVar10);
    (J->fold).ins.field_0.ot = 0x5784;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
    TVar7 = lj_opt_fold(J);
    BVar12 = (BCReg)((ulong)((long)puVar11 - (long)J->base) >> 2);
    J->maxslot = BVar12;
    if (puVar11 == pTVar2 + baseslot) {
      return TVar7;
    }
    uVar15 = BVar12 - 1;
    J->maxslot = uVar15;
    *puVar11 = TVar7;
    local_70.u64 = (ulong)(J[-1].penalty + 0x2c) | 0xfffd800000000000;
    pTVar9 = J->L->base;
  }
  else {
    uVar15 = topslot - 1;
    J->maxslot = uVar15;
    pTVar9 = J->L->base;
    local_70 = pTVar9[topslot];
    puVar11 = puVar10;
  }
  uVar13 = (ulong)uVar15;
  local_78 = pTVar9[uVar13];
  local_48 = puVar11[-1];
  local_44 = *puVar11;
  TVar3 = pTVar9[uVar13];
  TVar4 = (pTVar9 + uVar13)[1];
  TVar5 = pTVar9[uVar13 + 2];
  TVar6 = (pTVar9 + uVar13 + 2)[1];
  TVar1 = pTVar9[uVar13 + 4];
  rec_mm_arith(J,(RecordIndex *)&local_78.gcr,MM_concat);
  pTVar9 = J->L->base;
  pTVar9[uVar13 + 4] = TVar1;
  pTVar9[uVar13 + 2] = TVar5;
  (pTVar9 + uVar13 + 2)[1] = TVar6;
  pTVar9[uVar13] = TVar3;
  (pTVar9 + uVar13)[1] = TVar4;
  return 0;
}

Assistant:

static TRef rec_cat(jit_State *J, BCReg baseslot, BCReg topslot)
{
  TRef *top = &J->base[topslot];
  TValue savetv[5];
  BCReg s;
  RecordIndex ix;
  lj_assertJ(baseslot < topslot, "bad CAT arg");
  for (s = baseslot; s <= topslot; s++)
    (void)getslot(J, s);  /* Ensure all arguments have a reference. */
  if (tref_isnumber_str(top[0]) && tref_isnumber_str(top[-1])) {
    TRef tr, hdr, *trp, *xbase, *base = &J->base[baseslot];
    /* First convert numbers to strings. */
    for (trp = top; trp >= base; trp--) {
      if (tref_isnumber(*trp))
	*trp = emitir(IRT(IR_TOSTR, IRT_STR), *trp,
		      tref_isnum(*trp) ? IRTOSTR_NUM : IRTOSTR_INT);
      else if (!tref_isstr(*trp))
	break;
    }
    xbase = ++trp;
    tr = hdr = emitir(IRT(IR_BUFHDR, IRT_PGC),
		      lj_ir_kptr(J, &J2G(J)->tmpbuf), IRBUFHDR_RESET);
    do {
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, *trp++);
    } while (trp <= top);
    tr = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
    J->maxslot = (BCReg)(xbase - J->base);
    if (xbase == base) return tr;  /* Return simple concatenation result. */
    /* Pass partial result. */
    topslot = J->maxslot--;
    *xbase = tr;
    top = xbase;
    setstrV(J->L, &ix.keyv, &J2G(J)->strempty);  /* Simulate string result. */
  } else {
    J->maxslot = topslot-1;
    copyTV(J->L, &ix.keyv, &J->L->base[topslot]);
  }
  copyTV(J->L, &ix.tabv, &J->L->base[topslot-1]);
  ix.tab = top[-1];
  ix.key = top[0];
  memcpy(savetv, &J->L->base[topslot-1], sizeof(savetv));  /* Save slots. */
  rec_mm_arith(J, &ix, MM_concat);  /* Call __concat metamethod. */
  memcpy(&J->L->base[topslot-1], savetv, sizeof(savetv));  /* Restore slots. */
  return 0;  /* No result yet. */
}